

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O3

int ReadWebP(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  bool bVar1;
  int iVar2;
  VP8StatusCode VVar3;
  uint32_t uVar4;
  WebPDemuxer *dmux;
  uint32_t *puVar5;
  int iVar6;
  long *plVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  WebPChunkIterator chunk_iter;
  WebPData webp_data;
  WebPDecoderConfig config;
  WebPChunkIterator local_168;
  WebPData local_130;
  WebPDecoderConfig local_120;
  
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  iVar2 = WebPInitDecoderConfigInternal(&local_120,0x210);
  if (iVar2 == 0) {
    ReadWebP_cold_1();
    return 0;
  }
  VVar3 = WebPGetFeaturesInternal(data,data_size,&local_120.input,0x210);
  if (VVar3 != VP8_STATUS_OK) {
    PrintWebPError("input data",VVar3);
    return 0;
  }
  bVar8 = local_120.input.has_alpha != 0 && keep_alpha != 0;
  pic->width = local_120.input.width;
  pic->height = local_120.input.height;
  if (pic->use_argb == 0) {
    uVar10 = ((ulong)bVar8 * 2 + 3) * (long)local_120.input.width >> 1;
    pic->colorspace = (uint)bVar8 << 2;
  }
  else {
    uVar10 = (long)local_120.input.width << 2;
  }
  iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(uVar10,(long)local_120.input.height);
  VVar3 = VP8_STATUS_OUT_OF_MEMORY;
  if ((iVar2 != 0) && (iVar2 = WebPPictureAlloc(pic), iVar2 != 0)) {
    if (pic->use_argb == 0) {
      local_120.output.colorspace = bVar8 + MODE_YUV;
      local_120.output.u.RGBA.rgba = pic->y;
      local_120.output.u.YUVA.u = pic->u;
      local_120.output.u.RGBA.size = (size_t)pic->v;
      if (local_120.input.has_alpha != 0 && keep_alpha != 0) {
        local_120.output.u.YUVA.a = pic->a;
        iVar2 = pic->a_stride;
        local_120.output.u.YUVA.a_stride = iVar2;
      }
      else {
        iVar2 = pic->a_stride;
        local_120.output.u.YUVA.a = (uint8_t *)0x0;
        local_120.output.u.YUVA.a_stride = 0;
      }
      plVar7 = (long *)((long)&local_120.output.u + 0x48);
      local_120.output.u.YUVA.y_stride = pic->y_stride;
      local_120.output.u.YUVA.u_stride = pic->uv_stride;
      iVar6 = pic->height;
      local_120.output.u.YUVA.y_size = (size_t)(local_120.output.u.YUVA.y_stride * iVar6);
      local_120.output.u.YUVA.u_size =
           (size_t)(((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) * local_120.output.u.YUVA.u_stride);
      iVar2 = iVar2 * iVar6;
      local_120.output.u.YUVA.v_stride = local_120.output.u.YUVA.u_stride;
      local_120.output.u.YUVA.v_size = local_120.output.u.YUVA.u_size;
    }
    else {
      plVar7 = (long *)((long)&local_120.output.u + 0x10);
      local_120.output.colorspace = MODE_BGRA;
      local_120.output.u.RGBA.rgba = (uint8_t *)pic->argb;
      iVar2 = pic->argb_stride * 4;
      local_120.output.u.RGBA.stride = iVar2;
      iVar2 = iVar2 * pic->height;
    }
    *plVar7 = (long)iVar2;
    local_120.output.is_external_memory = 1;
    VVar3 = DecodeWebP(data,data_size,&local_120);
    if (((keep_alpha == 0 && VVar3 == VP8_STATUS_OK) && (pic->use_argb != 0)) &&
       (iVar2 = pic->height, 0 < iVar2)) {
      puVar5 = pic->argb;
      uVar10 = (ulong)(uint)pic->width;
      iVar6 = 0;
      do {
        if (0 < (int)uVar10) {
          lVar9 = 0;
          do {
            *(undefined1 *)((long)puVar5 + lVar9 * 4 + 3) = 0xff;
            lVar9 = lVar9 + 1;
            uVar10 = (ulong)pic->width;
          } while (lVar9 < (long)uVar10);
          iVar2 = pic->height;
        }
        puVar5 = puVar5 + pic->argb_stride;
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar2);
    }
    if (VVar3 == VP8_STATUS_OK) {
      bVar8 = true;
      bVar1 = false;
      goto LAB_00108f99;
    }
  }
  PrintWebPError("input data",VVar3);
  bVar1 = true;
  bVar8 = false;
LAB_00108f99:
  WebPFreeDecBuffer(&local_120.output);
  if (bVar8 && metadata != (Metadata *)0x0) {
    local_130.bytes = data;
    local_130.size = data_size;
    dmux = WebPDemuxInternal(&local_130,0,(WebPDemuxState *)0x0,0x107);
    if (dmux != (WebPDemuxer *)0x0) {
      uVar4 = WebPDemuxGetI(dmux,WEBP_FF_FORMAT_FLAGS);
      if (((uVar4 & 0x20) != 0) && (iVar2 = WebPDemuxGetChunk(dmux,"ICCP",1,&local_168), iVar2 != 0)
         ) {
        MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->iccp);
        WebPDemuxReleaseChunkIterator(&local_168);
      }
      if (((uVar4 & 8) != 0) && (iVar2 = WebPDemuxGetChunk(dmux,"EXIF",1,&local_168), iVar2 != 0)) {
        MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->exif);
        WebPDemuxReleaseChunkIterator(&local_168);
      }
      if (((uVar4 & 4) != 0) && (iVar2 = WebPDemuxGetChunk(dmux,"XMP ",1,&local_168), iVar2 != 0)) {
        MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->xmp);
        WebPDemuxReleaseChunkIterator(&local_168);
      }
      WebPDemuxDelete(dmux);
      return 1;
    }
    PrintWebPError("metadata",3);
  }
  else if (!bVar1) {
    return 1;
  }
  WebPPictureFree(pic);
  return 0;
}

Assistant:

int ReadWebP(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic,
             int keep_alpha, Metadata* const metadata) {
  int ok = 0;
  VP8StatusCode status = VP8_STATUS_OK;
  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    return 0;
  }

  status = WebPGetFeatures(data, data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    return 0;
  }

  do {
    const int has_alpha = keep_alpha && bitstream->has_alpha;
    uint64_t stride;
    pic->width = bitstream->width;
    pic->height = bitstream->height;
    if (pic->use_argb) {
      stride = (uint64_t)bitstream->width * 4;
    } else {
      stride = (uint64_t)bitstream->width * (has_alpha ? 5 : 3) / 2;
      pic->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
    }

    if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, bitstream->height)) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }

    ok = WebPPictureAlloc(pic);
    if (!ok) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }
    if (pic->use_argb) {
#ifdef WORDS_BIGENDIAN
      output_buffer->colorspace = MODE_ARGB;
#else
      output_buffer->colorspace = MODE_BGRA;
#endif
      output_buffer->u.RGBA.rgba = (uint8_t*)pic->argb;
      output_buffer->u.RGBA.stride = pic->argb_stride * sizeof(uint32_t);
      output_buffer->u.RGBA.size = output_buffer->u.RGBA.stride * pic->height;
    } else {
      output_buffer->colorspace = has_alpha ? MODE_YUVA : MODE_YUV;
      output_buffer->u.YUVA.y = pic->y;
      output_buffer->u.YUVA.u = pic->u;
      output_buffer->u.YUVA.v = pic->v;
      output_buffer->u.YUVA.a = has_alpha ? pic->a : NULL;
      output_buffer->u.YUVA.y_stride = pic->y_stride;
      output_buffer->u.YUVA.u_stride = pic->uv_stride;
      output_buffer->u.YUVA.v_stride = pic->uv_stride;
      output_buffer->u.YUVA.a_stride = has_alpha ? pic->a_stride : 0;
      output_buffer->u.YUVA.y_size = pic->height * pic->y_stride;
      output_buffer->u.YUVA.u_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.v_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.a_size = pic->height * pic->a_stride;
    }
    output_buffer->is_external_memory = 1;

    status = DecodeWebP(data, data_size, &config);
    ok = (status == VP8_STATUS_OK);
    if (ok && !keep_alpha && pic->use_argb) {
      // Need to wipe out the alpha value, as requested.
      int x, y;
      uint32_t* argb = pic->argb;
      for (y = 0; y < pic->height; ++y) {
        for (x = 0; x < pic->width; ++x) argb[x] |= 0xff000000u;
        argb += pic->argb_stride;
      }
    }
  } while (0);   // <- so we can 'break' out of the loop

  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    ok = 0;
  }

  WebPFreeDecBuffer(output_buffer);

  if (ok && metadata != NULL) {
    ok = ExtractMetadata(data, data_size, metadata);
    if (!ok) {
      PrintWebPError("metadata", VP8_STATUS_BITSTREAM_ERROR);
    }
  }
  if (!ok) WebPPictureFree(pic);
  return ok;
}